

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O0

void __thiscall
TPZEqnArray<std::complex<long_double>_>::TPZEqnArray(TPZEqnArray<std::complex<long_double>_> *this)

{
  undefined4 *in_RDI;
  int in_stack_ffffffffffffffbc;
  TPZStack<int,_100> *this_00;
  TPZStack<std::complex<long_double>,_1000> *this_01;
  
  this_01 = (TPZStack<std::complex<long_double>,_1000> *)(in_RDI + 2);
  TPZStack<int,_100>::TPZStack((TPZStack<int,_100> *)this_01);
  TPZStack<int,_100>::TPZStack((TPZStack<int,_100> *)this_01);
  TPZStack<std::complex<long_double>,_1000>::TPZStack(this_01);
  this_00 = (TPZStack<int,_100> *)(in_RDI + 0x2024);
  TPZStack<int,_1000>::TPZStack((TPZStack<int,_1000> *)this_01);
  TPZStack<int,_100>::Push(this_00,in_stack_ffffffffffffffbc);
  in_RDI[1] = 0;
  in_RDI[0x2414] = 0;
  *in_RDI = 0;
  return;
}

Assistant:

TPZEqnArray<TVar>::TPZEqnArray() : fEqStart(), fEqNumber(), fEqValues(), fIndex() {
	fEqStart.Push(0);
	fNumEq=0;
	fLastTerm=0;
	fSymmetric=EIsUndefined;
	
}